

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_copy_to_file.cpp
# Opt level: O2

void __thiscall
duckdb::CopyToFunctionLocalState::SetDataWithoutPartitions
          (CopyToFunctionLocalState *this,DataChunk *chunk,DataChunk *source,
          vector<duckdb::LogicalType,_true> *col_types,vector<unsigned_long,_true> *part_cols)

{
  iterator iVar1;
  reference this_00;
  const_reference other;
  size_type __n;
  ulong local_88;
  DataChunk *local_80;
  vector<duckdb::LogicalType,_true> types;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> part_col_set;
  
  LogicalCopyToFile::GetTypesWithoutPartitions(&types,col_types,part_cols,false);
  local_80 = chunk;
  DataChunk::InitializeEmpty(chunk,&types);
  ::std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>::
  set<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>> *)
             &part_col_set,
             (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(part_cols->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(part_cols->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish);
  __n = 0;
  for (local_88 = 0;
      local_88 <
      (ulong)(((long)(source->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)(source->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_start) / 0x68); local_88 = local_88 + 1) {
    iVar1 = ::std::
            _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
            ::find(&part_col_set._M_t,&local_88);
    if ((_Rb_tree_header *)iVar1._M_node == &part_col_set._M_t._M_impl.super__Rb_tree_header) {
      this_00 = vector<duckdb::Vector,_true>::get<true>(&local_80->data,__n);
      other = vector<duckdb::Vector,_true>::get<true>(&source->data,local_88);
      Vector::Reference(this_00,other);
      __n = __n + 1;
    }
  }
  local_80->count = source->count;
  ::std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(&part_col_set._M_t);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            (&types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  return;
}

Assistant:

void SetDataWithoutPartitions(DataChunk &chunk, const DataChunk &source, const vector<LogicalType> &col_types,
	                              const vector<idx_t> &part_cols) {
		D_ASSERT(source.ColumnCount() == col_types.size());
		auto types = LogicalCopyToFile::GetTypesWithoutPartitions(col_types, part_cols, false);
		chunk.InitializeEmpty(types);
		set<idx_t> part_col_set(part_cols.begin(), part_cols.end());
		idx_t new_col_id = 0;
		for (idx_t col_idx = 0; col_idx < source.ColumnCount(); col_idx++) {
			if (part_col_set.find(col_idx) == part_col_set.end()) {
				chunk.data[new_col_id].Reference(source.data[col_idx]);
				new_col_id++;
			}
		}
		chunk.SetCardinality(source.size());
	}